

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer_holder.hpp
# Opt level: O0

void * __thiscall
boost::python::objects::
pointer_holder<std::unique_ptr<NeuralConsumer_python,_std::default_delete<NeuralConsumer_python>_>,_NeuralConsumer_python>
::holds(pointer_holder<std::unique_ptr<NeuralConsumer_python,_std::default_delete<NeuralConsumer_python>_>,_NeuralConsumer_python>
        *this,type_info dst_t,bool null_ptr_only)

{
  bool bVar1;
  bool bVar2;
  NeuralConsumer_python *pNVar3;
  type_info tVar4;
  byte in_DL;
  type_info in_RSI;
  pointer_holder<std::unique_ptr<NeuralConsumer_python,_std::default_delete<NeuralConsumer_python>_>,_NeuralConsumer_python>
  *in_RDI;
  type_info src_t;
  void *wrapped;
  non_const_value *p;
  NeuralConsumer_python *p0;
  type_info *in_stack_ffffffffffffff78;
  type_info *in_stack_ffffffffffffff80;
  NeuralConsumer_python *local_8;
  
  type_id<std::unique_ptr<NeuralConsumer_python,std::default_delete<NeuralConsumer_python>>>();
  bVar1 = type_info::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar2 = false;
  if (bVar1) {
    bVar2 = false;
    if ((in_DL & 1) != 0) {
      pNVar3 = get_pointer<NeuralConsumer_python>
                         ((unique_ptr<NeuralConsumer_python,_std::default_delete<NeuralConsumer_python>_>
                           *)0x4058b6);
      bVar2 = pNVar3 != (NeuralConsumer_python *)0x0;
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (bVar2) {
    local_8 = (NeuralConsumer_python *)&in_RDI->m_p;
  }
  else {
    pNVar3 = get_pointer<NeuralConsumer_python>
                       ((unique_ptr<NeuralConsumer_python,_std::default_delete<NeuralConsumer_python>_>
                         *)0x4058f9);
    if (pNVar3 == (NeuralConsumer_python *)0x0) {
      local_8 = (NeuralConsumer_python *)0x0;
    }
    else {
      local_8 = (NeuralConsumer_python *)holds_wrapped(in_RDI,in_RSI,pNVar3,pNVar3);
      if (local_8 == (NeuralConsumer_python *)0x0) {
        tVar4 = type_id<NeuralConsumer_python>();
        bVar2 = type_info::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        local_8 = pNVar3;
        if (!bVar2) {
          local_8 = (NeuralConsumer_python *)find_dynamic_type(pNVar3,tVar4,in_RSI);
        }
      }
    }
  }
  return local_8;
}

Assistant:

void* pointer_holder<Pointer, Value>::holds(type_info dst_t, bool null_ptr_only)
{
    typedef typename boost::python::detail::remove_const< Value >::type non_const_value;

    if (dst_t == python::type_id<Pointer>()
        && !(null_ptr_only && get_pointer(this->m_p))
    )
        return &this->m_p;

    Value* p0
#  if BOOST_WORKAROUND(__SUNPRO_CC, BOOST_TESTED_AT(0x590))
        = static_cast<Value*>( get_pointer(this->m_p) )
#  else 
        = get_pointer(this->m_p)
#  endif
        ;
    non_const_value* p = const_cast<non_const_value*>( p0 );

    if (p == 0)
        return 0;
    
    if (void* wrapped = holds_wrapped(dst_t, p, p))
        return wrapped;
    
    type_info src_t = python::type_id<non_const_value>();
    return src_t == dst_t ? p : find_dynamic_type(p, src_t, dst_t);
}